

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_NtkNodeNumFunc(Au_Ntk_t *p,int Func)

{
  int iVar1;
  Au_Obj_t *p_00;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Au_Obj_t *pObj;
  int Func_local;
  Au_Ntk_t *p_local;
  
  local_30 = 0;
  if ((p->pMan == (Au_Man_t *)0x0) || (p->pMan->pFuncs == (Abc_Nam_t *)0x0)) {
    for (local_2c = 0; iVar1 = Vec_IntSize(&p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
      p_00 = Au_NtkObjI(p,local_2c);
      iVar1 = Au_ObjIsNode(p_00);
      if (iVar1 != 0) {
        local_30 = (uint)(((uint)*(undefined8 *)p_00 & 0x3fffffff) == Func) + local_30;
      }
    }
    p_local._4_4_ = local_30;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Au_NtkNodeNumFunc( Au_Ntk_t * p, int Func )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pMan && p->pMan->pFuncs )
        return 0;
    Au_NtkForEachNode( p, pObj, i )
    {
        Counter += (pObj->Func == (unsigned)Func);
//        printf( "%d ", pObj->Func );
    }
//    printf( "\n" );
    return Counter;
}